

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiInst(Fts5Context *pCtx,int iIdx,int *piPhrase,int *piCol,int *piOff)

{
  int local_3c;
  int rc;
  Fts5Cursor *pCsr;
  int *piOff_local;
  int *piCol_local;
  int *piPhrase_local;
  int iIdx_local;
  Fts5Context *pCtx_local;
  
  local_3c = 0;
  if (((*(uint *)(pCtx + 0x50) & 8) == 0) ||
     (local_3c = fts5CacheInstArray((Fts5Cursor *)pCtx), local_3c == 0)) {
    if ((iIdx < 0) || (*(int *)(pCtx + 0xac) <= iIdx)) {
      local_3c = 0x19;
    }
    else {
      *piPhrase = *(int *)(*(long *)(pCtx + 0xb0) + (long)(iIdx * 3) * 4);
      *piCol = *(int *)(*(long *)(pCtx + 0xb0) + (long)(iIdx * 3 + 1) * 4);
      *piOff = *(int *)(*(long *)(pCtx + 0xb0) + (long)(iIdx * 3 + 2) * 4);
    }
  }
  return local_3c;
}

Assistant:

static int fts5ApiInst(
  Fts5Context *pCtx, 
  int iIdx, 
  int *piPhrase, 
  int *piCol, 
  int *piOff
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int rc = SQLITE_OK;
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_INST)==0 
   || SQLITE_OK==(rc = fts5CacheInstArray(pCsr)) 
  ){
    if( iIdx<0 || iIdx>=pCsr->nInstCount ){
      rc = SQLITE_RANGE;
#if 0
    }else if( fts5IsOffsetless((Fts5Table*)pCsr->base.pVtab) ){
      *piPhrase = pCsr->aInst[iIdx*3];
      *piCol = pCsr->aInst[iIdx*3 + 2];
      *piOff = -1;
#endif
    }else{
      *piPhrase = pCsr->aInst[iIdx*3];
      *piCol = pCsr->aInst[iIdx*3 + 1];
      *piOff = pCsr->aInst[iIdx*3 + 2];
    }
  }
  return rc;
}